

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> * __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::parseInto
          (vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
           *__return_storage_ptr__,CommandLine<Catch::ConfigData> *this,int argc,char **argv,
          ConfigData *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  IArgFunction<Catch::ConfigData> *pIVar2;
  long lVar3;
  Parser parser;
  string processName;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> tokens;
  Parser local_88;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> local_48;
  
  std::__cxx11::string::string((string *)local_68,*argv,(allocator *)&local_88);
  lVar3 = std::__cxx11::string::find_last_of((char *)local_68,0x192ab5,0xffffffffffffffff);
  if (lVar3 != -1) {
    std::__cxx11::string::substr((ulong)&local_88,(ulong)local_68);
    std::__cxx11::string::operator=((string *)local_68,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.separators._M_dataplus._M_p != &local_88.separators.field_2) {
      operator_delete(local_88.separators._M_dataplus._M_p);
    }
  }
  pIVar2 = (this->m_boundProcessName).functionObj;
  (*pIVar2->_vptr_IArgFunction[2])(pIVar2,config,local_68);
  local_48.
  super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar1 = &local_88.separators.field_2;
  local_88.separators.field_2._M_allocated_capacity._0_4_ = 0x3a3d0920;
  local_88.separators._M_string_length = 4;
  local_88.separators.field_2._M_local_buf[4] = '\0';
  local_88.separators._M_dataplus._M_p = (pointer)paVar1;
  Parser::parseIntoTokens(&local_88,argc,argv,&local_48);
  populate(__return_storage_ptr__,this,&local_48,config);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.separators._M_dataplus._M_p != paVar1) {
    operator_delete(local_88.separators._M_dataplus._M_p);
  }
  std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::~vector
            (&local_48);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Parser::Token> parseInto( int argc, char const * const * argv, ConfigT& config ) const {
            std::string processName = argv[0];
            std::size_t lastSlash = processName.find_last_of( "/\\" );
            if( lastSlash != std::string::npos )
                processName = processName.substr( lastSlash+1 );
            m_boundProcessName.set( config, processName );
            std::vector<Parser::Token> tokens;
            Parser parser;
            parser.parseIntoTokens( argc, argv, tokens );
            return populate( tokens, config );
        }